

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O1

void __thiscall
cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::
~socket_acceptor(socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_acceptor)._vptr_acceptor = (_func_int **)&PTR_async_accept_0028e048;
  p_Var1 = (this->factory_).rewrite_.
           super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->factory_).watchdog_.
           super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar2 = (this->factory_).ip_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->factory_).ip_.field_2) {
    operator_delete(pcVar2);
  }
  booster::aio::acceptor::~acceptor(&this->acceptor_);
  p_Var1 = (this->api_).
           super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(this);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string ip,int port,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(true),
				sndbuf_(-1),
				rcvbuf_(-1)
			{
				io::endpoint ep(ip,port);
				acceptor_.open(ep.family());
                #ifndef CPPCMS_WIN32
				acceptor_.set_option(io::basic_socket::reuse_address,true);
                #endif
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}